

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_gamma_decode(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  uVar6 = 0;
  uVar3 = (ulong)(uint)*out_size;
  if (*out_size < 1) {
    uVar3 = uVar6;
  }
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    sVar4 = in->byte;
    iVar5 = -1;
    uVar8 = in->bit;
    do {
      bVar1 = in->data[sVar4];
      uVar7 = uVar8 - 1;
      in->bit = uVar7;
      if (uVar8 == 0) {
        in->bit = 7;
        sVar4 = sVar4 + 1;
        in->byte = sVar4;
        uVar7 = 7;
      }
      iVar5 = iVar5 + 1;
      uVar2 = uVar8 & 0x1f;
      uVar8 = uVar7;
    } while ((bVar1 >> uVar2 & 1) == 0);
    iVar9 = 1;
    for (; 0 < iVar5; iVar5 = iVar5 + -1) {
      iVar9 = (uint)((in->data[sVar4] >> (uVar7 & 0x1f) & 1) != 0) + iVar9 * 2;
      sVar4 = sVar4 + ((int)uVar7 < 1);
      in->byte = sVar4;
      uVar7 = uVar7 - 1 & 7;
      in->bit = uVar7;
    }
    *(int *)(out + uVar6 * 4) = iVar9 - (c->field_6).huffman.ncodes;
  }
  return 0;
}

Assistant:

int cram_gamma_decode(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;

    for (i = 0, n = *out_size; i < n; i++) {
	int nz = 0;
	int val;
	//while (get_bit_MSB(in) == 0) nz++;
	nz = get_zero_bits_MSB(in);
	val = 1;
	while (nz > 0) {
	    //val <<= 1; val |= get_bit_MSB(in);
	    GET_BIT_MSB(in, val);
	    nz--;
	}

	out_i[i] = val - c->gamma.offset;
    }

    return 0;
}